

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O2

pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_bool>
* __thiscall
ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::
try_emplace<std::array<std::__cxx11::string,2ul>const&>
          (pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_bool>
           *__return_storage_ptr__,dynamic_metric_impl<std::atomic<long>,(unsigned_char)2> *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *key)

{
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  view;
  anon_class_1_0_00000001 local_11;
  key_type local_10;
  
  local_10._M_ptr = key->_M_elems;
  util::
  map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<137ul>>
  ::
  try_emplace_with_op<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::try_emplace<std::array<std::__cxx11::string,2ul>const&>(std::array<std::__cxx11::string,2ul>const&)::_lambda(auto:1)_1_,std::array<std::__cxx11::string,2ul>const&>
            (__return_storage_ptr__,
             (map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<137ul>>
              *)(this + 0xb8),&local_10,&local_11,key);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<metric_pair>, bool> try_emplace(Key&& key,
                                                            Args&&... args) {
    std::span<const std::string, N> view = key;
    return map_.try_emplace_with_op(
        view,
        [](auto result) {
          if (result.second) {
            *const_cast<std::span<const std::string, N>*>(
                &result.first->first) = result.first->second->label;
          }
        },
        std::forward<Key>(key), std::forward<Args>(args)...);
  }